

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_checkPiTarget(ENCODING *enc,char *ptr,char *end,int *tokPtr)

{
  bool bVar1;
  int upper;
  int *tokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  bVar1 = false;
  *tokPtr = 0xb;
  if ((long)end - (long)ptr == 3) {
    if (*ptr == 'X') {
      bVar1 = true;
    }
    else if (*ptr != 'x') {
      return 1;
    }
    if (ptr[1] == 'M') {
      bVar1 = true;
    }
    else if (ptr[1] != 'm') {
      return 1;
    }
    if (ptr[2] == 'L') {
      bVar1 = true;
    }
    else if (ptr[2] != 'l') {
      return 1;
    }
    if (bVar1) {
      enc_local._4_4_ = 0;
    }
    else {
      *tokPtr = 0xc;
      enc_local._4_4_ = 1;
    }
  }
  else {
    enc_local._4_4_ = 1;
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(checkPiTarget)(const ENCODING *enc, const char *ptr, const char *end,
                      int *tokPtr) {
  int upper = 0;
  UNUSED_P(enc);
  *tokPtr = XML_TOK_PI;
  if (end - ptr != MINBPC(enc) * 3)
    return 1;
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_x:
    break;
  case ASCII_X:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_m:
    break;
  case ASCII_M:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_l:
    break;
  case ASCII_L:
    upper = 1;
    break;
  default:
    return 1;
  }
  if (upper)
    return 0;
  *tokPtr = XML_TOK_XML_DECL;
  return 1;
}